

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_conv.c
# Opt level: O0

void field_name_strip_get_default(FMField *io_field,char *out_field_name,void **default_val)

{
  char *pcVar1;
  char *pcVar2;
  char *in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  FMdata_type data_type;
  char *base_type;
  char *s1;
  char *s;
  void **in_stack_00000090;
  int in_stack_00000098;
  FMdata_type in_stack_0000009c;
  char *in_stack_000000a0;
  char *in_stack_ffffffffffffffd0;
  
  pcVar1 = base_data_type(in_stack_ffffffffffffffd0);
  FMstr_to_data_type(in_RDX);
  strncpy(in_RSI,(char *)*in_RDI,0x80);
  pcVar2 = strchr(in_RSI,0x28);
  in_RDX[0] = '\0';
  in_RDX[1] = '\0';
  in_RDX[2] = '\0';
  in_RDX[3] = '\0';
  in_RDX[4] = '\0';
  in_RDX[5] = '\0';
  in_RDX[6] = '\0';
  in_RDX[7] = '\0';
  free(pcVar1);
  if (pcVar2 != (char *)0x0) {
    *pcVar2 = '\0';
    pcVar1 = strchr(pcVar2 + 1,0x29);
    if (pcVar1 != (char *)0x0) {
      *pcVar1 = '\0';
    }
    if (0 < (int)pcVar1 - (int)(pcVar2 + 1)) {
      str_to_val(in_stack_000000a0,in_stack_0000009c,in_stack_00000098,in_stack_00000090);
    }
  }
  return;
}

Assistant:

static void
field_name_strip_get_default(const FMField *io_field, char *out_field_name, void **default_val)
{
    char *s, *s1;
    char *base_type = base_data_type(io_field->field_type);
    FMdata_type data_type = FMstr_to_data_type(base_type);
    strncpy(out_field_name, io_field->field_name, 128);
    s = strchr(out_field_name, '(');
    *default_val = NULL;
    free(base_type);
    if(s) {
	*s = '\0';
	s++;
	s1 = strchr(s, ')');
	if(s1) {
	    *s1 = '\0';
	}
	if((int)(s1-s)> 0){
	    str_to_val(s, data_type, io_field->field_size, default_val);
	}
    }
}